

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# connection.cpp
# Opt level: O0

void __thiscall Connection::~Connection(Connection *this)

{
  Connection *this_local;
  
  if ((this->connected & 1U) != 0) {
    disconnect(this);
  }
  std::vector<char,_std::allocator<char>_>::~vector(&this->buf_fc_);
  std::vector<char,_std::allocator<char>_>::~vector(&this->buf_cf_);
  return;
}

Assistant:

Connection::~Connection() {
    if (connected) {
        disconnect();
    }
}